

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * Lowerer::LoadFloatFromNonReg(Opnd *opndSrc,Opnd *opndDst,Instr *instrInsert)

{
  IRType IVar1;
  Var aValue;
  code *pcVar2;
  bool bVar3;
  AddrOpnd *pAVar4;
  IntConstOpnd *pIVar5;
  ulong uVar6;
  FloatConstOpnd *pFVar7;
  Float32ConstOpnd *pFVar8;
  undefined4 *puVar9;
  Instr *pIVar10;
  FloatConstType value;
  
  bVar3 = IR::Opnd::IsAddrOpnd(opndSrc);
  if (bVar3) {
    pAVar4 = IR::Opnd::AsAddrOpnd(opndSrc);
    aValue = pAVar4->m_address;
    bVar3 = Js::TaggedInt::Is(aValue);
    if (bVar3) {
      value = (FloatConstType)(int)aValue;
    }
    else {
      value = Js::JavascriptNumber::GetValue(aValue);
    }
  }
  else {
    bVar3 = IR::Opnd::IsIntConstOpnd(opndSrc);
    if (bVar3) {
      IVar1 = opndSrc->m_type;
      pIVar5 = IR::Opnd::AsIntConstOpnd(opndSrc);
      uVar6 = (pIVar5->super_EncodableOpnd<long>).m_value;
      if (IVar1 == TyUint32) {
        uVar6 = uVar6 & 0xffffffff;
      }
      value = (FloatConstType)(long)uVar6;
    }
    else {
      bVar3 = IR::Opnd::IsFloatConstOpnd(opndSrc);
      if (bVar3) {
        pFVar7 = IR::Opnd::AsFloatConstOpnd(opndSrc);
        value = pFVar7->m_value;
      }
      else {
        bVar3 = IR::Opnd::IsFloat32ConstOpnd(opndSrc);
        if (bVar3) {
          pFVar8 = IR::Opnd::AsFloat32ConstOpnd(opndSrc);
          pIVar10 = LowererMD::LoadFloatValue<float>(opndDst,pFVar8->m_value,instrInsert);
          return pIVar10;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x398f,"(0)","Unexpected opnd type");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
        value = 0.0;
      }
    }
  }
  pIVar10 = LowererMD::LoadFloatValue<double>(opndDst,value,instrInsert);
  return pIVar10;
}

Assistant:

IR::Instr *
Lowerer::LoadFloatFromNonReg(IR::Opnd * opndSrc, IR::Opnd * opndDst, IR::Instr * instrInsert)
{
    double value;

    if (opndSrc->IsAddrOpnd())
    {
        Js::Var var = opndSrc->AsAddrOpnd()->m_address;
        if (Js::TaggedInt::Is(var))
        {
            value = Js::TaggedInt::ToDouble(var);
        }
        else
        {
            value = Js::JavascriptNumber::GetValue(var);
        }
    }
    else if (opndSrc->IsIntConstOpnd())
    {
        if (opndSrc->IsUInt32())
        {
            value = (double)(uint32)opndSrc->AsIntConstOpnd()->GetValue();
        }
        else
        {
            value = (double)opndSrc->AsIntConstOpnd()->GetValue();
        }
    }
    else if (opndSrc->IsFloatConstOpnd())
    {
        value = (double)opndSrc->AsFloatConstOpnd()->m_value;
    }
    else if (opndSrc->IsFloat32ConstOpnd())
    {
        float floatValue = opndSrc->AsFloat32ConstOpnd()->m_value;
        return LowererMD::LoadFloatValue(opndDst, floatValue, instrInsert);
    }
    else
    {
        AssertMsg(0, "Unexpected opnd type");
        value = 0;
    }

    return LowererMD::LoadFloatValue(opndDst, value, instrInsert);
}